

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O1

void vrna_md_set_default(vrna_md_t *md)

{
  undefined8 uVar1;
  long lVar2;
  long lVar3;
  vrna_md_t *md_1;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  
  bVar6 = 0;
  if (md != &defaults && md != (vrna_md_t *)0x0) {
    memcpy(md,&defaults,0x7e8);
    uVar1 = defaults.rtype._24_8_;
    *(undefined8 *)(md->rtype + 4) = defaults.rtype._16_8_;
    *(undefined8 *)(md->rtype + 6) = uVar1;
    uVar1 = defaults.rtype._8_8_;
    *(undefined8 *)md->rtype = defaults.rtype._0_8_;
    *(undefined8 *)(md->rtype + 2) = uVar1;
    uVar1 = CONCAT62(defaults.alias._26_6_,defaults.alias[0xc]);
    *(undefined8 *)(md->alias + 8) = defaults.alias._16_8_;
    *(undefined8 *)(md->alias + 0xc) = uVar1;
    uVar1 = defaults.alias._8_8_;
    *(undefined8 *)md->alias = defaults.alias._0_8_;
    *(undefined8 *)(md->alias + 4) = uVar1;
    uVar1 = defaults.alias._34_8_;
    *(ulong *)(md->alias + 0xd) = CONCAT26(defaults.alias[0x10],defaults.alias._26_6_);
    *(undefined8 *)(md->alias + 0x11) = uVar1;
    uVar1 = defaults.nonstandards._56_8_;
    *(undefined8 *)(md->nonstandards + 0x30) = defaults.nonstandards._48_8_;
    *(undefined8 *)(md->nonstandards + 0x38) = uVar1;
    uVar1 = defaults.nonstandards._40_8_;
    *(undefined8 *)(md->nonstandards + 0x20) = defaults.nonstandards._32_8_;
    *(undefined8 *)(md->nonstandards + 0x28) = uVar1;
    uVar1 = defaults.nonstandards._8_8_;
    *(undefined8 *)md->nonstandards = defaults.nonstandards._0_8_;
    *(undefined8 *)(md->nonstandards + 8) = uVar1;
    uVar1 = defaults.nonstandards._24_8_;
    *(undefined8 *)(md->nonstandards + 0x10) = defaults.nonstandards._16_8_;
    *(undefined8 *)(md->nonstandards + 0x18) = uVar1;
    lVar2 = 0x104;
    do {
      pcVar4 = defaults.nonstandards + lVar2 + -0x48;
      pcVar5 = md->nonstandards + lVar2 + -0x48;
      for (lVar3 = 0x15; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)pcVar5 = *(undefined4 *)pcVar4;
        pcVar4 = pcVar4 + ((ulong)bVar6 * -2 + 1) * 4;
        pcVar5 = pcVar5 + ((ulong)bVar6 * -2 + 1) * 4;
      }
      lVar2 = lVar2 + 0x54;
    } while (lVar2 != 0x7e8);
  }
  return;
}

Assistant:

PUBLIC void
vrna_md_set_default(vrna_md_t *md)
{
  if (md) /* copy defaults */
    vrna_md_copy(md, &defaults);
}